

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,void *pos,long branchIndex,undefined8 *first,undefined8 *rest,
          undefined8 rest_1,undefined8 rest_2,undefined8 rest_3,undefined8 rest_4,undefined8 rest_5,
          undefined8 rest_6,undefined8 rest_7,undefined8 rest_8,undefined8 rest_9,undefined8 rest_10
          ,undefined8 rest_11,undefined8 rest_12,undefined8 rest_13,undefined8 rest_14,
          undefined8 rest_15,undefined8 rest_16,undefined8 rest_17,undefined8 rest_18,
          undefined8 rest_19,undefined8 rest_20,undefined8 rest_21,undefined8 rest_22,
          undefined8 rest_23,undefined8 rest_24,undefined8 rest_25,undefined8 rest_26,
          undefined8 rest_27,undefined8 rest_28,undefined8 rest_29,undefined8 rest_30,
          undefined8 rest_31,undefined8 rest_32,undefined8 rest_33,undefined8 rest_34,
          undefined8 rest_35,undefined8 rest_36,undefined8 rest_37,undefined8 rest_38,
          undefined8 rest_39,undefined8 rest_40,undefined8 rest_41,undefined8 rest_42,
          undefined8 rest_43,undefined8 rest_44,undefined8 rest_45,undefined8 rest_46,
          undefined8 rest_47,undefined8 rest_48,undefined8 rest_49,undefined8 rest_50,
          undefined8 rest_51,undefined8 rest_52,undefined8 rest_53,undefined8 rest_54,
          undefined8 rest_55,undefined8 rest_56,undefined8 rest_57,undefined8 rest_58,
          undefined8 rest_59,undefined8 rest_60,undefined8 rest_61,undefined8 rest_62,
          undefined8 rest_63)

{
  Array<kj::StringTree::Branch> *pAVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pcVar5;
  ArrayDisposer *pAVar6;
  Branch *pBVar7;
  size_t __n;
  char *pcVar8;
  size_t sVar9;
  undefined8 in_stack_000001f8;
  undefined8 in_stack_00000200;
  
  pcVar8 = (char *)(this->text).content.size_;
  if (pcVar8 != (char *)0x0) {
    pcVar8 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar8;
  sVar2 = first[1];
  sVar9 = 0;
  if (sVar2 != 0) {
    sVar9 = sVar2 - 1;
  }
  pcVar8 = (char *)*first;
  pAVar3 = (ArrayDisposer *)first[2];
  *first = 0;
  first[1] = 0;
  pBVar4 = (this->branches).ptr;
  pBVar4[branchIndex].content.size_ = sVar9;
  pcVar5 = pBVar4[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar9 = pBVar4[branchIndex].content.text.content.size_;
    pBVar4[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar4[branchIndex].content.text.content.size_ = 0;
    pAVar6 = pBVar4[branchIndex].content.text.content.disposer;
    (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar5,1,sVar9,sVar9,0);
  }
  pBVar4[branchIndex].content.text.content.ptr = pcVar8;
  pBVar4[branchIndex].content.text.content.size_ = sVar2;
  pBVar4[branchIndex].content.text.content.disposer = pAVar3;
  pAVar1 = &pBVar4[branchIndex].content.branches;
  pBVar7 = pBVar4[branchIndex].content.branches.ptr;
  if (pBVar7 != (Branch *)0x0) {
    sVar2 = pBVar4[branchIndex].content.branches.size_;
    pAVar1->ptr = (Branch *)0x0;
    pBVar4[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar4[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar7,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pAVar1->ptr = (Branch *)0x0;
  pBVar4[branchIndex].content.branches.size_ = 0;
  pBVar4[branchIndex].content.branches.disposer = (ArrayDisposer *)0x0;
  __n = rest[1];
  if (__n != 0) {
    memcpy(pos,(void *)*rest,__n);
    pos = (void *)((long)pos + __n);
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9
             ,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,
             rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30
             ,rest_31,rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,
             rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49,rest_50,rest_51
             ,rest_52,rest_53,rest_54,rest_55,rest_56,rest_57,rest_58,rest_59,rest_60,rest_61,
             rest_62,rest_63,in_stack_000001f8,in_stack_00000200);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}